

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_45a12::MapDriver::collectReliabilityStatistics
          (MapDriver *this,float currentTime,float elapsedTime)

{
  bool bVar1;
  ostream *poVar2;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float in_XMM1_Da;
  ostringstream message;
  MapDriver *in_stack_00000048;
  float timeSinceLastCollision;
  ostringstream *in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  float in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe8c;
  AbstractLocalSpace *in_stack_fffffffffffffe90;
  TerrainMap *in_stack_fffffffffffffe98;
  
  bVar1 = TerrainMap::scanLocalXZRectangle
                    (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                     in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
  *(bool *)(in_RDI + 0x21) = bVar1;
  fVar3 = in_XMM0_Da - *(float *)((long)in_RDI + 0x10c);
  if ((((*(byte *)(in_RDI + 0x21) & 1) != 0) && ((*(byte *)((long)in_RDI + 0x109) & 1) == 0)) &&
     (1.0 < fVar3)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe70);
    poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe70,"collision after ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar3);
    std::operator<<(poVar2," seconds");
    OpenSteer::OpenSteerDemo::printMessage(in_stack_fffffffffffffe70);
    *(float *)(in_RDI + 0x22) = fVar3 + *(float *)(in_RDI + 0x22);
    *(int *)((long)in_RDI + 0x114) = *(int *)((long)in_RDI + 0x114) + 1;
    *(float *)((long)in_RDI + 0x10c) = in_XMM0_Da;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe70);
  }
  *(byte *)((long)in_RDI + 0x109) = *(byte *)(in_RDI + 0x21) & 1;
  fVar3 = (float)(**(code **)(*in_RDI + 0xd8))();
  *(float *)(in_RDI + 0x23) = fVar3 * in_XMM1_Da + *(float *)(in_RDI + 0x23);
  *(float *)((long)in_RDI + 0x11c) = in_XMM1_Da + *(float *)((long)in_RDI + 0x11c);
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    *(float *)(in_RDI + 0x24) = in_XMM1_Da + *(float *)(in_RDI + 0x24);
    bVar1 = bodyInsidePath(in_stack_00000048);
    if (!bVar1) {
      *(float *)((long)in_RDI + 0x124) = in_XMM1_Da + *(float *)((long)in_RDI + 0x124);
    }
  }
  return;
}

Assistant:

void collectReliabilityStatistics (const float currentTime,
                                           const float elapsedTime)
        {
            // detect obstacle avoidance failure and keep statistics
            collisionDetected = map->scanLocalXZRectangle (*this,
                                                           -halfWidth, halfWidth,
                                                           -halfLength,halfLength);

            // record stats to compute mean time between collisions
            const float timeSinceLastCollision = currentTime - timeOfLastCollision;
            if (collisionDetected &&
                !collisionLastTime &&
                (timeSinceLastCollision > 1))
            {
                std::ostringstream message;
                message << "collision after "<<timeSinceLastCollision<<" seconds";
                OpenSteerDemo::printMessage (message);
                sumOfCollisionFreeTimes += timeSinceLastCollision;
                countOfCollisionFreeTimes++;
                timeOfLastCollision = currentTime;
            }
            collisionLastTime = collisionDetected;

            // keep track of average speed
            totalDistance += speed () * elapsedTime;
            totalTime += elapsedTime;

            // keep track of path following failure rate
            // QQQ for now, duplicating this code from the draw method:
            // if we are following a path but are off the path,
            // draw a red line to where we should be
            if (demoSelect == 2)
            {
                pathFollowTime += elapsedTime;
                if (! bodyInsidePath ()) pathFollowOffTime += elapsedTime;
            }
        }